

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_forest.cpp
# Opt level: O0

void run_dataset<sift>(size_t tree_max_leaf_size,size_t forest_size,size_t forest_max_leaf_size,
                      size_t forest_max_leaves_visited)

{
  _Setprecision _Var1;
  size_t sVar2;
  ostream *poVar3;
  size_type sVar4;
  size_t in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  float fVar5;
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
  *unaff_retaddr;
  vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> *in_stack_00000008;
  vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> *in_stack_00000010;
  size_t equal;
  string fn_nns_gt;
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_> nns;
  vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> test;
  vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> train;
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
  *in_stack_00000440;
  string *in_stack_00000448;
  vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> *in_stack_00000450;
  vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> *in_stack_00000458;
  max_leaf_size_t in_stack_00000460;
  float fVar6;
  float local_c4;
  char *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  max_leaf_size_t local_a0;
  string local_98 [32];
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
  local_78 [4];
  
  sift::read_train();
  sift::read_test();
  pico_tree::std::
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>::vector
            ((vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
              *)0x103b4d);
  std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  pico_tree::max_leaf_size_t::max_leaf_size_t(&local_a0,in_RDI);
  run_kd_tree<std::array<float,128ul>,float>
            (in_stack_00000458,in_stack_00000450,in_stack_00000448,in_stack_00000460,
             in_stack_00000440);
  sVar2 = run_kd_forest<std::array<float,128ul>,float>
                    (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,in_RDX);
  _Var1 = pico_tree::std::setprecision(10);
  std::operator<<((ostream *)&std::cout,_Var1);
  poVar3 = std::operator<<((ostream *)&std::cout,"Precision: ");
  local_c4 = (float)sVar2;
  sVar4 = pico_tree::std::
          vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
          ::size(local_78);
  fVar5 = (float)(long)sVar4;
  fVar6 = (float)sVar4;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c4 / fVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_98);
  pico_tree::std::
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>::
  ~vector((vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
           *)CONCAT44(fVar6,fVar5));
  pico_tree::std::vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>::
  ~vector((vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> *)
          CONCAT44(fVar6,fVar5));
  pico_tree::std::vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>::
  ~vector((vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> *)
          CONCAT44(fVar6,fVar5));
  return;
}

Assistant:

void run_dataset(
    std::size_t tree_max_leaf_size,
    std::size_t forest_size,
    std::size_t forest_max_leaf_size,
    std::size_t forest_max_leaves_visited) {
  using Point = typename Dataset_::point_type;
  using scalar_type = typename Point::value_type;

  auto train = Dataset_::read_train();
  auto test = Dataset_::read_test();
  std::vector<pico_tree::neighbor<int, scalar_type>> nns;
  std::string fn_nns_gt = Dataset_::dataset_name + "_nns_gt.bin";

  run_kd_tree(train, test, fn_nns_gt, tree_max_leaf_size, nns);

  std::size_t equal = run_kd_forest(
      train,
      test,
      nns,
      forest_size,
      forest_max_leaf_size,
      forest_max_leaves_visited);

  std::cout << std::setprecision(10);
  std::cout << "Precision: "
            << (static_cast<float>(equal) / static_cast<float>(nns.size()))
            << std::endl;
}